

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O3

void __thiscall Js::SharedContents::AddAgent(SharedContents *this,DWORD_PTR agent)

{
  int iVar1;
  HeapAllocator *alloc;
  SharableAgents *this_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  CCLock::Enter(&(this->csAgent).super_CCLock);
  this_00 = this->allowedAgents;
  if (this_00 == (SharableAgents *)0x0) {
    local_58 = (undefined1  [8])
               &JsUtil::
                List<unsigned_long,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_8e234c3;
    data.filename._0_4_ = 0xf;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
    this_00 = (SharableAgents *)new<Memory::HeapAllocator>(0x30,alloc,0x2ff150);
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).alloc =
         &Memory::HeapAllocator::Instance;
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_0152f170;
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer =
         (Type)0x0;
    (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count = 0;
    this_00->length = 0;
    this_00->increment = 4;
    this->allowedAgents = this_00;
  }
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(this_00,0);
  iVar1 = (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count
  ;
  (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer[iVar1]
       = agent;
  (this_00->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count =
       iVar1 + 1;
  CCLock::Leave(&(this->csAgent).super_CCLock);
  return;
}

Assistant:

void SharedContents::AddAgent(DWORD_PTR agent)
    {
        AutoCriticalSection autoCS(&csAgent);
        if (allowedAgents == nullptr)
        {
            allowedAgents = HeapNew(SharableAgents, &HeapAllocator::Instance);
        }

        allowedAgents->Add(agent);
    }